

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

int match(char **sp,char *t)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)*sp;
  do {
    pbVar4 = pbVar4 + 1;
    bVar1 = *t;
    if (bVar1 == 0) {
      *sp = (char *)pbVar4;
      return 1;
    }
    t = (char *)((byte *)t + 1);
    bVar2 = *pbVar4;
    bVar3 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar3 = bVar2;
    }
  } while (bVar3 == bVar1);
  return 0;
}

Assistant:

static int
match(const char **sp, const char *t)
{
	int c, d;
	const char *s = *sp;

	while((d = *t++)) {
		if ((c = *++s) >= 'A' && c <= 'Z')
			c += 'a' - 'A';
		if (c != d)
			return 0;
		}
	*sp = s + 1;
	return 1;
	}